

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_number.cpp
# Opt level: O3

void __thiscall JsonNumber_IntegerMax_Test::TestBody(JsonNumber_IntegerMax_Test *this)

{
  VTable *pVVar1;
  TypedExpectation<std::error_code_(unsigned_long)> *this_00;
  parser<callbacks_proxy<mock_json_callbacks>_> *this_01;
  pointer *__ptr;
  char *in_R9;
  string str_max;
  AssertHelper AStack_118;
  Message local_110;
  string local_108;
  internal local_e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  VTable *local_d8;
  index_type local_d0;
  undefined1 local_c8 [16];
  undefined1 local_b8 [8];
  deque<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>_>_>
  local_b0;
  int local_60;
  _Alloc_hider local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  local_d8 = (VTable *)local_c8;
  std::__cxx11::string::_M_construct((ulong)&local_d8,'\x13');
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_d8,0x13,0x7fffffffffffffff);
  testing::Matcher<unsigned_long>::Matcher((Matcher<unsigned_long> *)&local_108,0x7fffffffffffffff);
  mock_json_callbacks::gmock_uint64_value
            ((MockSpec<std::error_code_(unsigned_long)> *)local_b8,
             &(this->super_JsonNumber).callbacks_.super_mock_json_callbacks,
             (Matcher<unsigned_long> *)&local_108);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<std::error_code_(unsigned_long)>::InternalExpectedAt
                      ((MockSpec<std::error_code_(unsigned_long)> *)local_b8,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_number.cpp"
                       ,0xb5,"callbacks_","uint64_value (long_max)");
  testing::internal::TypedExpectation<std::error_code_(unsigned_long)>::Times(this_00,1);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)&local_b0);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)&local_108);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::parser
            ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_b8,
             (this->super_JsonNumber).proxy_.original_,none);
  pVVar1 = local_d8;
  pstore::gsl::details::extent_type<-1L>::extent_type((extent_type<_1L> *)&local_108,local_d0);
  local_108._M_string_length = (size_type)pVVar1;
  this_01 = pstore::json::parser<callbacks_proxy<mock_json_callbacks>>::
            input<pstore::gsl::span<char_const,_1l>>
                      ((parser<callbacks_proxy<mock_json_callbacks>> *)local_b8,
                       (span<const_char,__1L> *)&local_108);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::eof(this_01);
  local_e8[0] = (internal)(local_60 == 0);
  local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_e8[0]) {
    testing::Message::Message(&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_108,local_e8,(AssertionResult *)"p.has_error ()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_number.cpp"
               ,0xb8,local_108._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_118,&local_110);
    testing::internal::AssertHelper::~AssertHelper(&AStack_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if (local_110.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_110.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
    if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_e0,local_e0);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_p != &local_30) {
    operator_delete(local_40._M_p,local_30._M_allocated_capacity + 1);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>_>_>
  ::~deque(&local_b0);
  if (local_b8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_b8,0x68);
  }
  if (local_d8 != (VTable *)local_c8) {
    operator_delete(local_d8,local_c8._0_8_ + 1);
  }
  return;
}

Assistant:

TEST_F (JsonNumber, IntegerMax) {
    constexpr auto long_max = std::numeric_limits<std::int64_t>::max ();
    auto const str_max = std::to_string (long_max);

    EXPECT_CALL (callbacks_, uint64_value (long_max)).Times (1);
    json::parser<decltype (proxy_)> p (proxy_);
    p.input (str_max).eof ();
    EXPECT_FALSE (p.has_error ());
}